

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O2

void __thiscall
lcp<dna_bwt_n<dna_string_n>,_unsigned_short>::lcp
          (lcp<dna_bwt_n<dna_string_n>,_unsigned_short> *this,dna_bwt_n<dna_string_n> *bwt)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  size_type sVar7;
  unsigned_long uVar8;
  size_type sVar9;
  _Elt_pointer psVar10;
  ulong uVar11;
  lcp<dna_bwt_n<dna_string_n>,_unsigned_short> *LCP;
  long lVar12;
  int iVar13;
  int t;
  uint64_t lcp_values;
  lcp<dna_bwt_n<dna_string_n>,_unsigned_short> *local_140;
  dna_bwt_n<dna_string_n> *local_138;
  size_type local_130;
  sa_leaf L;
  stack<sa_leaf,_std::deque<sa_leaf,_std::allocator<sa_leaf>_>_> S;
  vector<sa_leaf,_std::allocator<sa_leaf>_> TMP_LEAVES;
  sa_leaf root;
  
  (this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->n = 0;
  this->bwt = (dna_bwt_n<dna_string_n> *)0x0;
  (this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nil = 0xffff;
  sVar7 = bwt->n;
  this->n = sVar7;
  local_138 = bwt;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&S,sVar7,&this->nil,
             (allocator_type *)&TMP_LEAVES);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign(&this->LCP,&S);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&S);
  *(this->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values."
                          );
  std::endl<char,std::char_traits<char>>(poVar6);
  lcp_values = 1;
  std::vector<sa_leaf,_std::allocator<sa_leaf>_>::vector(&TMP_LEAVES,5,(allocator_type *)&S);
  std::stack<sa_leaf,std::deque<sa_leaf,std::allocator<sa_leaf>>>::
  stack<std::deque<sa_leaf,std::allocator<sa_leaf>>,void>(&S);
  root.rn.first = 0;
  root.rn.second = local_138->F_A;
  root.depth = 0;
  local_140 = this;
  std::deque<sa_leaf,_std::allocator<sa_leaf>_>::push_back(&S.c,&root);
  uVar11 = 0xffffffffffffffff;
  local_130 = 0;
  while (S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur) {
    psVar10 = S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      psVar10 = S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    L.depth = psVar10[-1].depth;
    L.rn.first = psVar10[-1].rn.first;
    L.rn.second = psVar10[-1].rn.second;
    std::deque<sa_leaf,_std::allocator<sa_leaf>_>::pop_back(&S.c);
    sVar7 = std::deque<sa_leaf,_std::allocator<sa_leaf>_>::size(&S.c);
    if (local_130 < sVar7) {
      local_130 = std::deque<sa_leaf,_std::allocator<sa_leaf>_>::size(&S.c);
    }
    puVar1 = (local_140->LCP).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar8 = L.rn.first;
    while( true ) {
      uVar8 = uVar8 + 1;
      if (L.rn.second <= uVar8) break;
      puVar1[uVar8] = (unsigned_short)L.depth;
      lcp_values = lcp_values + 1;
    }
    t = 0;
    dna_bwt_n<dna_string_n>::next_leaves(local_138,&L,&TMP_LEAVES,&t,2);
    iVar13 = t + 1;
    lVar12 = (ulong)(uint)t * 0x18;
    while (iVar13 = iVar13 + -1, 0 < iVar13) {
      std::deque<sa_leaf,_std::allocator<sa_leaf>_>::push_back
                (&S.c,(value_type *)
                      ((long)&TMP_LEAVES.super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>.
                              _M_impl.super__Vector_impl_data._M_start[-1].rn.first + lVar12));
      lVar12 = lVar12 + -0x18;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_140->n;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = lcp_values * 100;
    iVar13 = SUB164(auVar4 / auVar2,0);
    if ((int)uVar11 < iVar13) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar13);
      poVar6 = std::operator<<(poVar6,"%.");
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar11 = SUB168(auVar4 / auVar2,0) & 0xffffffff;
    }
  }
  std::_Deque_base<sa_leaf,_std::allocator<sa_leaf>_>::~_Deque_base
            ((_Deque_base<sa_leaf,_std::allocator<sa_leaf>_> *)&S);
  std::_Vector_base<sa_leaf,_std::allocator<sa_leaf>_>::~_Vector_base
            (&TMP_LEAVES.super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>);
  LCP = local_140;
  poVar6 = std::operator<<((ostream *)&std::cout,"Visited leaves cover ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," input characters.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," suffix-tree leaves of size >= 2.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "\nNow navigating suffix tree nodes to compute remaining LCP values.");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::vector<sa_node_n,_std::allocator<sa_node_n>_>::vector
            ((vector<sa_node_n,_std::allocator<sa_node_n>_> *)&L,5,(allocator_type *)&S);
  std::stack<sa_node_n,std::deque<sa_node_n,std::allocator<sa_node_n>>>::
  stack<std::deque<sa_node_n,std::allocator<sa_node_n>>,void>
            ((stack<sa_node_n,_std::deque<sa_node_n,_std::allocator<sa_node_n>_>_> *)&S);
  TMP_LEAVES.super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  TMP_LEAVES.super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_138->F_A;
  TMP_LEAVES.super__Vector_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_138->F_C;
  std::deque<sa_node_n,_std::allocator<sa_node_n>_>::push_back
            ((deque<sa_node_n,_std::allocator<sa_node_n>_> *)&S,(value_type *)&TMP_LEAVES);
  uVar11 = 0xffffffffffffffff;
  sVar7 = 0;
  while (S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur) {
    sVar9 = std::deque<sa_node_n,_std::allocator<sa_node_n>_>::size
                      ((deque<sa_node_n,_std::allocator<sa_node_n>_> *)&S);
    if (sVar7 < sVar9) {
      sVar7 = std::deque<sa_node_n,_std::allocator<sa_node_n>_>::size
                        ((deque<sa_node_n,_std::allocator<sa_node_n>_> *)&S);
    }
    psVar10 = S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      psVar10 = (_Elt_pointer)
                &S.c.super__Deque_base<sa_leaf,_std::allocator<sa_leaf>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1][0x15].rn.second;
    }
    root.rn.first = psVar10[-3].rn.second;
    root.rn.second = psVar10[-3].depth;
    root.depth = psVar10[-2].rn.first;
    std::deque<sa_node_n,_std::allocator<sa_node_n>_>::pop_back
              ((deque<sa_node_n,_std::allocator<sa_node_n>_> *)&S);
    update_lcp<unsigned_short>((sa_node_n *)&root,&LCP->LCP,&lcp_values);
    t = 0;
    dna_bwt_n<dna_string_n>::next_nodes
              (local_138,(sa_node_n *)&root,(vector<sa_node_n,_std::allocator<sa_node_n>_> *)&L,&t);
    iVar13 = t + 1;
    lVar12 = (ulong)(uint)t * 0x40;
    while( true ) {
      LCP = local_140;
      lVar12 = lVar12 + -0x40;
      iVar13 = iVar13 + -1;
      if (iVar13 < 1) break;
      std::deque<sa_node_n,_std::allocator<sa_node_n>_>::push_back
                ((deque<sa_node_n,_std::allocator<sa_node_n>_> *)&S,
                 (value_type *)(lVar12 + L.rn.first));
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_140->n;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = lcp_values * 100;
    iVar13 = SUB164(auVar5 / auVar3,0);
    if ((int)uVar11 < iVar13) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LCP: ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar13);
      poVar6 = std::operator<<(poVar6,"%.");
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar11 = SUB168(auVar5 / auVar3,0) & 0xffffffff;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Computed ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"/");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," LCP values.");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Max stack size = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"Processed ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6," suffix-tree nodes.");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::_Deque_base<sa_node_n,_std::allocator<sa_node_n>_>::~_Deque_base
            ((_Deque_base<sa_node_n,_std::allocator<sa_node_n>_> *)&S);
  std::_Vector_base<sa_node_n,_std::allocator<sa_node_n>_>::~_Vector_base
            ((_Vector_base<sa_node_n,_std::allocator<sa_node_n>_> *)&L);
  return;
}

Assistant:

lcp(bwt_t * bwt){

		this->bwt;

		n = bwt->size();

		LCP = vector<lcp_int_t>(n, nil);
		LCP[0] = 0;

		/*
		 * FIRST PASS: LEAVES NAVIGATION. COMPUTE LCP VALUES INSIDE SUFFIX TREE LEAVES.
		 */

		cout << "\nNow navigating suffix tree leaves of size >= 2 to compute internal LCP values." << endl;

		uint64_t m = 0;//portion of text covered by visited leaves
		uint64_t leaves = 0;//number of visited leaves
		uint64_t max_stack = 0;
		uint64_t lcp_values = 1;//number of filled LCP values

		{

			auto TMP_LEAVES = vector<sa_leaf>(5);

			stack<sa_leaf> S;

			sa_leaf root = bwt->first_leaf();
			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				sa_leaf L = S.top();
				S.pop();
				leaves++;

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				assert(L.rn.second > L.rn.first);

				for(uint64_t i = L.rn.first+1; i<L.rn.second; ++i){

					assert(LCP[i]==nil);

					LCP[i] = L.depth;

					lcp_values++;
					m++;

				}

				m++;

				assert(m<=n);

				int t = 0;

				bwt->next_leaves(L, TMP_LEAVES, t, 2);

				for(int i=t-1;i>=0;--i) S.push(TMP_LEAVES[i]);

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}
		}

		cout << "Visited leaves cover " << m << "/" << n << " input characters." << endl;
		cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;

		cout << "Max stack size = " << max_stack << endl;
		cout << "Processed " << leaves << " suffix-tree leaves of size >= 2." << endl;

		cout << "\nNow navigating suffix tree nodes to compute remaining LCP values." << endl;

		{

			auto TMP_NODES = vector<typename bwt_t::sa_node_t>(5);

			uint64_t nodes = 0;//visited ST nodes
			max_stack = 0;

			stack<typename bwt_t::sa_node_t> S;

			typename bwt_t::sa_node_t root = bwt->root();

			S.push(root);

			int last_perc = -1;
			int perc = 0;

			while(not S.empty()){

				max_stack = S.size() > max_stack ? S.size() : max_stack;

				typename bwt_t::sa_node_t N = S.top();
				S.pop();
				nodes++;

				update_lcp<lcp_int_t>(N,LCP,lcp_values);

				int t = 0;

				bwt->next_nodes(N, TMP_NODES, t);

				for(int i=t-1;i>=0;--i){

					S.push(TMP_NODES[i]);

				}

				perc = (100*lcp_values)/n;

				if(perc > last_perc){

					cout << "LCP: " << perc << "%." << endl;
					last_perc = perc;

				}

			}

			cout << "Computed " << lcp_values << "/" << n << " LCP values." << endl;
			cout << "Max stack size = " << max_stack << endl;
			cout << "Processed " << nodes << " suffix-tree nodes." << endl;

		}


	}